

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_getMTCtxParameter(ZSTDMT_CCtx *mtctx,ZSTDMT_parameter parameter,int *value)

{
  int *value_local;
  ZSTDMT_parameter parameter_local;
  ZSTDMT_CCtx *mtctx_local;
  
  if (parameter == ZSTDMT_p_jobSize) {
    mtctx_local = (ZSTDMT_CCtx *)ZSTD_CCtxParams_getParameter(&mtctx->params,ZSTD_c_jobSize,value);
  }
  else if (parameter == ZSTDMT_p_overlapLog) {
    mtctx_local = (ZSTDMT_CCtx *)
                  ZSTD_CCtxParams_getParameter(&mtctx->params,ZSTD_c_overlapLog,value);
  }
  else if (parameter == ZSTDMT_p_rsyncable) {
    mtctx_local = (ZSTDMT_CCtx *)
                  ZSTD_CCtxParams_getParameter(&mtctx->params,ZSTD_c_experimentalParam1,value);
  }
  else {
    mtctx_local = (ZSTDMT_CCtx *)0xffffffffffffffd8;
  }
  return (size_t)mtctx_local;
}

Assistant:

size_t ZSTDMT_getMTCtxParameter(ZSTDMT_CCtx* mtctx, ZSTDMT_parameter parameter, int* value)
{
    switch (parameter) {
    case ZSTDMT_p_jobSize:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_jobSize, value);
    case ZSTDMT_p_overlapLog:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_overlapLog, value);
    case ZSTDMT_p_rsyncable:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_rsyncable, value);
    default:
        return ERROR(parameter_unsupported);
    }
}